

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O3

void sf::priv::GlContext::initResource(void)

{
  int iVar1;
  GlxContext *this;
  Lock lock;
  Lock local_40;
  ContextSettings local_38;
  
  Lock::Lock(&local_40,(Mutex *)&(anonymous_namespace)::GlContextImpl::mutex);
  if ((anonymous_namespace)::GlContextImpl::resourceCount == 0) {
    iVar1 = 1;
    if ((anonymous_namespace)::GlContextImpl::sharedContext != (GlxContext *)0x0) goto LAB_0018b7b1;
    this = (GlxContext *)operator_new(0x58);
    GlxContext::GlxContext(this,(GlxContext *)0x0);
    local_38.depthBits = 0;
    local_38.stencilBits = 0;
    local_38.antialiasingLevel = 0;
    local_38.majorVersion = 1;
    local_38.minorVersion = 1;
    local_38.attributeFlags = 0;
    local_38.sRgbCapable = false;
    (anonymous_namespace)::GlContextImpl::sharedContext = this;
    initialize((GlContext *)this,&local_38);
    anon_unknown.dwarf_2b48f9::GlContextImpl::loadExtensions();
    setActive(&(anonymous_namespace)::GlContextImpl::sharedContext->super_GlContext,false);
  }
  iVar1 = (anonymous_namespace)::GlContextImpl::resourceCount + 1;
LAB_0018b7b1:
  (anonymous_namespace)::GlContextImpl::resourceCount = iVar1;
  Lock::~Lock(&local_40);
  return;
}

Assistant:

void GlContext::initResource()
{
    using GlContextImpl::mutex;
    using GlContextImpl::resourceCount;
    using GlContextImpl::currentContext;
    using GlContextImpl::sharedContext;
    using GlContextImpl::loadExtensions;

    // Protect from concurrent access
    Lock lock(mutex);

    // If this is the very first resource, trigger the global context initialization
    if (resourceCount == 0)
    {
        if (sharedContext)
        {
            // Increment the resources counter
            resourceCount++;

            return;
        }

        // Create the shared context
        sharedContext = new ContextType(NULL);
        sharedContext->initialize(ContextSettings());

        // Load our extensions vector
        loadExtensions();

        // Deactivate the shared context so that others can activate it when necessary
        sharedContext->setActive(false);
    }

    // Increment the resources counter
    resourceCount++;
}